

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

IRIns * lj_snap_regspmap(jit_State *J,GCtrace *T,SnapNo snapno,IRIns *ir)

{
  byte *pbVar1;
  char *pcVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  bool bVar5;
  IRIns *pIVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  IRRef1 IVar11;
  IRIns *pIVar12;
  
  uVar3 = T->snap[snapno].mapofs;
  uVar10 = (ulong)(T->nins - 1);
  uVar9 = 0;
  if (*(char *)((long)T->ir + uVar10 * 8 + 5) == '\x14') {
    pIVar6 = T->ir + uVar10;
    uVar10 = 0;
    do {
      if ((pIVar6->field_0).op2 <= snapno) {
        uVar10 = uVar10 | 1L << ((ulong)*(byte *)pIVar6 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar6 + -3);
      pIVar6 = pIVar6 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    uVar10 = 0;
  }
  pSVar4 = T->snapmap;
  do {
    pIVar6 = ir;
    if ((ir->field_1).o == '\x0e') {
      uVar7 = (ir->field_0).op1 + 0x8000;
LAB_0012f1da:
      pIVar12 = T->ir;
      IVar11 = *(IRRef1 *)((long)pIVar12 + (ulong)uVar7 * 8 + 6);
      if (((uVar10 >> ((ulong)uVar7 & 0x3f) & 1) != 0) &&
         (uVar8 = (ulong)(T->nins - 1), *(char *)((long)pIVar12 + uVar8 * 8 + 5) == '\x14')) {
        pIVar12 = pIVar12 + uVar8;
        do {
          if ((uVar7 == (pIVar12->field_0).op1) && ((pIVar12->field_0).op2 <= snapno)) {
            IVar11 = (pIVar12->field_0).prev;
          }
          pcVar2 = (char *)((long)pIVar12 + -3);
          pIVar12 = pIVar12 + -1;
        } while (*pcVar2 == '\x14');
      }
      (ir->field_0).prev = IVar11;
      bVar5 = true;
    }
    else {
      if (((ir->field_1).o == 'G') && (((ir->field_0).op2 & 1) != 0)) {
        do {
          uVar8 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (pSVar4[uVar3 + uVar8] >> 0x18 != (uint)(ir->field_0).op1);
        uVar7 = pSVar4[uVar3 + uVar8] & 0xffff;
        goto LAB_0012f1da;
      }
      bVar5 = false;
    }
    ir = ir + 1;
    if (!bVar5) {
      return pIVar6;
    }
  } while( true );
}

Assistant:

IRIns *lj_snap_regspmap(jit_State *J, GCtrace *T, SnapNo snapno, IRIns *ir)
{
  SnapShot *snap = &T->snap[snapno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  MSize n = 0;
  IRRef ref = 0;
  UNUSED(J);
  for ( ; ; ir++) {
    uint32_t rs;
    if (ir->o == IR_SLOAD) {
      if (!(ir->op2 & IRSLOAD_PARENT)) break;
      for ( ; ; n++) {
	lj_assertJ(n < snap->nent, "slot %d not found in snapshot", ir->op1);
	if (snap_slot(map[n]) == ir->op1) {
	  ref = snap_ref(map[n++]);
	  break;
	}
      }
    } else if (LJ_SOFTFP32 && ir->o == IR_HIOP) {
      ref++;
    } else if (ir->o == IR_PVAL) {
      ref = ir->op1 + REF_BIAS;
    } else {
      break;
    }
    rs = T->ir[ref].prev;
    if (bloomtest(rfilt, ref))
      rs = snap_renameref(T, snapno, ref, rs);
    ir->prev = (uint16_t)rs;
    lj_assertJ(regsp_used(rs), "unused IR %04d in snapshot", ref - REF_BIAS);
  }
  return ir;
}